

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

void __thiscall QWaitCondition::QWaitCondition(QWaitCondition *this)

{
  void *pvVar1;
  long *in_RDI;
  pthread_cond_t *in_stack_00000018;
  char *in_stack_ffffffffffffffe8;
  
  pvVar1 = operator_new(0x60);
  *in_RDI = (long)pvVar1;
  pthread_mutex_init((pthread_mutex_t *)*in_RDI,(pthread_mutexattr_t *)0x0);
  qt_report_pthread_error((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,(char *)0x6d966d);
  qt_initialize_pthread_cond(in_stack_00000018,(char *)this);
  *(undefined4 *)(*in_RDI + 0x5c) = 0;
  *(undefined4 *)(*in_RDI + 0x58) = 0;
  return;
}

Assistant:

QWaitCondition::QWaitCondition()
{
    d = new QWaitConditionPrivate;
    qt_report_pthread_error(pthread_mutex_init(&d->mutex, nullptr), "QWaitCondition", "mutex init");
    qt_initialize_pthread_cond(&d->cond, "QWaitCondition");
    d->waiters = d->wakeups = 0;
}